

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_20;
  float in_stack_ffffffffffffffe4;
  ImVec2 local_18;
  
  pIVar2 = GImGui;
  if (((((GImGui->CurrentWindow->Appearing & 1U) != 0) &&
       (GImGui->NavWindow == GImGui->CurrentWindow->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (GImGui->NavWindow->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar2->NavInitResultId = (pIVar2->NavWindow->DC).LastItemId;
    local_28 = ::operator-(in_stack_ffffffffffffffc8,(ImVec2 *)0x1e56f8);
    local_30 = ::operator-(in_stack_ffffffffffffffc8,(ImVec2 *)0x1e571d);
    ImRect::ImRect((ImRect *)&local_20,&local_28,&local_30);
    IVar1.y = in_stack_ffffffffffffffe4;
    IVar1.x = local_20;
    (pIVar2->NavInitResultRectRel).Min = IVar1;
    (pIVar2->NavInitResultRectRel).Max = local_18;
    NavUpdateAnyRequestFlag();
    bVar3 = IsItemVisible();
    if (!bVar3) {
      SetScrollHereY(in_stack_ffffffffffffffe4);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}